

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cc
# Opt level: O0

Type * anon_unknown.dwarf_bff3::load_numeric(TypeNode *node,Factory *factory)

{
  xmlChar *name;
  unsigned_long uVar1;
  Numeric *this;
  NumericCategory NVar2;
  Type *type;
  size_t size;
  _anonymous_namespace_ local_48 [32];
  xmlChar *local_28;
  NumericCategory category;
  Factory *factory_local;
  TypeNode *node_local;
  
  category._8_8_ = factory;
  (anonymous_namespace)::getAttribute<std::__cxx11::string>(local_48,node->xml,"category");
  name = (xmlChar *)std::__cxx11::string::c_str();
  NVar2 = getCategoryFromNode<(anonymous_namespace)::NumericCategory>
                    ((NumericCategory *)(anonymous_namespace)::numeric_categories,name);
  local_28 = NVar2.name;
  category.name._0_4_ = NVar2.type;
  std::__cxx11::string::~string((string *)local_48);
  uVar1 = getAttribute<unsigned_long>(node->xml,"size");
  this = (Numeric *)operator_new(0x48);
  Typelib::Numeric::Numeric(this,(string *)&node->name,uVar1,(NumericCategory)category.name);
  Factory::insert((Factory *)category._8_8_,node,(Type *)this);
  return (Type *)this;
}

Assistant:

Type const* load_numeric(TypeNode const& node, Factory& factory)
    {
        NumericCategory category = getCategoryFromNode
            ( numeric_categories
            , reinterpret_cast<xmlChar const*>(getAttribute<string>(node.xml, "category").c_str()) );
        size_t      size = getAttribute<size_t>(node.xml, "size");

        Type* type = new Numeric(node.name, size, category.type);
        factory.insert(node, type);
        return type;
    }